

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

void * IsoSpec::quickselect(void **array,int n,int start,int end)

{
  long lVar1;
  double dVar2;
  double *pdVar3;
  void *pvVar4;
  result_type_conflict rVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  iVar8 = start;
  if (start != end) {
    while( true ) {
      iVar10 = end;
      rVar5 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)random_gen);
      uVar7 = rVar5 % (ulong)(long)(iVar10 - iVar8);
      lVar6 = (long)iVar8;
      pdVar3 = (double *)array[uVar7 + lVar6];
      dVar2 = *pdVar3;
      lVar9 = (long)iVar10;
      lVar1 = lVar9 + -1;
      array[uVar7 + lVar6] = array[lVar9 + -1];
      array[lVar9 + -1] = pdVar3;
      end = iVar8;
      for (; lVar6 < lVar1; lVar6 = lVar6 + 1) {
        pdVar3 = (double *)array[lVar6];
        if (*pdVar3 <= dVar2 && dVar2 != *pdVar3) {
          array[lVar6] = array[end];
          array[end] = pdVar3;
          end = end + 1;
        }
      }
      pvVar4 = array[lVar1];
      array[lVar1] = array[end];
      array[end] = pvVar4;
      start = n;
      if (end == n) break;
      if (end <= n) {
        iVar8 = end + 1;
        end = iVar10;
      }
    }
  }
  return array[start];
}

Assistant:

void* quickselect(void ** array, int n, int start, int end)
{
    if(start == end)
        return array[start];

    while(true)
    {
        // Partition part
        int len = end - start;
#if ISOSPEC_BUILDING_R
        int pivot = len/2 + start;
#else
        size_t pivot = random_gen() % len + start;  // Using Mersenne twister directly - we don't
                                                    // need a very uniform distribution just for pivot
                                                    // selection
#endif
        void* pval = array[pivot];
        double pprob = getLProb(pval);
        std::swap(array[pivot], array[end-1]);
        int loweridx = start;
        for(int i = start; i < end-1; i++)
        {
            if(getLProb(array[i]) < pprob)
            {
                std::swap(array[i], array[loweridx]);
                loweridx++;
            }
        }
        std::swap(array[end-1], array[loweridx]);

        // Selection part
        if(n == loweridx)
            return array[n];
        if(n < loweridx)
            end = loweridx;
        else
            start = loweridx+1;
    };
}